

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int update_1rtt_key(quicly_conn_t *conn,ptls_cipher_suite_t *cipher,int is_enc,
                   ptls_aead_context_t **aead,uint8_t *secret)

{
  ptls_iovec_t hash_value;
  int iVar1;
  long *in_RCX;
  long in_RSI;
  void *in_R8;
  ptls_iovec_t secret_00;
  ptls_iovec_t pVar2;
  int ret;
  ptls_aead_context_t *new_aead;
  uint8_t new_secret [64];
  char *label;
  ptls_aead_algorithm_t *aead_00;
  uint in_stack_ffffffffffffff88;
  uint8_t *puVar3;
  size_t in_stack_ffffffffffffff98;
  ptls_hash_algorithm_t *in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffa8;
  
  puVar3 = (uint8_t *)0x0;
  label = &stack0xffffffffffffff98;
  aead_00 = *(ptls_aead_algorithm_t **)(*(long *)(in_RSI + 0x10) + 8);
  secret_00 = ptls_iovec_init(in_R8,*(size_t *)(*(long *)(in_RSI + 0x10) + 8));
  pVar2 = ptls_iovec_init((void *)0x0,0);
  hash_value.len = in_stack_ffffffffffffff98;
  hash_value.base = puVar3;
  iVar1 = ptls_hkdf_expand_label
                    ((ptls_hash_algorithm_t *)pVar2.len,pVar2.base,(size_t)aead_00,secret_00,label,
                     hash_value,(char *)in_stack_ffffffffffffffa0);
  if ((iVar1 == 0) &&
     (iVar1 = setup_cipher((quicly_conn_t *)(ulong)in_stack_ffffffffffffff88,secret_00.len,
                           secret_00.base._4_4_,(ptls_cipher_context_t **)pVar2.len,
                           (ptls_aead_context_t **)pVar2.base,aead_00,in_stack_ffffffffffffffa0,
                           in_stack_ffffffffffffffa8), iVar1 == 0)) {
    if (*in_RCX != 0) {
      ptls_aead_free((ptls_aead_context_t *)0x14376d);
    }
    *in_RCX = (long)puVar3;
    puVar3 = (uint8_t *)0x0;
    memcpy(in_R8,&stack0xffffffffffffff98,*(size_t *)(*(long *)(in_RSI + 0x10) + 8));
    iVar1 = 0;
  }
  if (puVar3 != (uint8_t *)0x0) {
    ptls_aead_free((ptls_aead_context_t *)0x1437c2);
  }
  (*ptls_clear_memory)(&stack0xffffffffffffff98,*(size_t *)(*(long *)(in_RSI + 0x10) + 8));
  return iVar1;
}

Assistant:

static int update_1rtt_key(quicly_conn_t *conn, ptls_cipher_suite_t *cipher, int is_enc, ptls_aead_context_t **aead,
                           uint8_t *secret)
{
    uint8_t new_secret[PTLS_MAX_DIGEST_SIZE];
    ptls_aead_context_t *new_aead = NULL;
    int ret;

    /* generate next AEAD key */
    if ((ret = ptls_hkdf_expand_label(cipher->hash, new_secret, cipher->hash->digest_size,
                                      ptls_iovec_init(secret, cipher->hash->digest_size), "quic ku", ptls_iovec_init(NULL, 0),
                                      NULL)) != 0)
        goto Exit;
    if ((ret = setup_cipher(conn, QUICLY_EPOCH_1RTT, is_enc, NULL, &new_aead, cipher->aead, cipher->hash, new_secret)) != 0)
        goto Exit;

    /* success! update AEAD and secret */
    if (*aead != NULL)
        ptls_aead_free(*aead);
    *aead = new_aead;
    new_aead = NULL;
    memcpy(secret, new_secret, cipher->hash->digest_size);

    ret = 0;
Exit:
    if (new_aead != NULL)
        ptls_aead_free(new_aead);
    ptls_clear_memory(new_secret, cipher->hash->digest_size);
    return ret;
}